

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O1

Gia_Man_t * Bmc_SuperBuildTents(Gia_Man_t *p,Vec_Int_t **pvMap)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *pGVar7;
  bool bVar8;
  Vec_Int_t *vIns;
  int *piVar9;
  Vec_Int_t *vCuts;
  Vec_Int_t *p_00;
  Vec_Int_t *vObjs;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  Vec_Int_t *p_04;
  Vec_Int_t *vRankIns;
  Vec_Int_t *vRankCuts;
  Vec_Int_t *p_05;
  Gia_Man_t *p_06;
  size_t sVar10;
  char *pcVar11;
  Gia_Obj_t *pGVar12;
  Vec_Int_t *pVVar13;
  Gia_Man_t *pGVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  long local_70;
  
  vIns = (Vec_Int_t *)malloc(0x10);
  vIns->nCap = 1000;
  vIns->nSize = 0;
  piVar9 = (int *)malloc(4000);
  vIns->pArray = piVar9;
  vCuts = (Vec_Int_t *)malloc(0x10);
  vCuts->nCap = 1000;
  vCuts->nSize = 0;
  piVar9 = (int *)malloc(4000);
  vCuts->pArray = piVar9;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar9 = (int *)malloc(4000);
  p_00->pArray = piVar9;
  vObjs = (Vec_Int_t *)malloc(0x10);
  vObjs->nCap = 1000;
  vObjs->nSize = 0;
  piVar9 = (int *)malloc(4000);
  vObjs->pArray = piVar9;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 1000;
  p_01->nSize = 0;
  piVar9 = (int *)malloc(4000);
  p_01->pArray = piVar9;
  p_02 = (Vec_Int_t *)malloc(0x10);
  p_02->nCap = 1000;
  p_02->nSize = 0;
  piVar9 = (int *)malloc(4000);
  p_02->pArray = piVar9;
  p_03 = (Vec_Int_t *)malloc(0x10);
  p_03->nCap = 1000;
  p_03->nSize = 0;
  piVar9 = (int *)malloc(4000);
  p_03->pArray = piVar9;
  p_04 = (Vec_Int_t *)malloc(0x10);
  p_04->nCap = 1000;
  p_04->nSize = 0;
  piVar9 = (int *)malloc(4000);
  p_04->pArray = piVar9;
  vRankIns = (Vec_Int_t *)malloc(0x10);
  vRankIns->nCap = 1000;
  vRankIns->nSize = 0;
  piVar9 = (int *)malloc(4000);
  vRankIns->pArray = piVar9;
  vRankCuts = (Vec_Int_t *)malloc(0x10);
  vRankCuts->nCap = 1000;
  vRankCuts->nSize = 0;
  piVar9 = (int *)malloc(4000);
  vRankCuts->pArray = piVar9;
  p_05 = (Vec_Int_t *)malloc(0x10);
  p_05->nCap = 1000;
  p_05->nSize = 0;
  piVar9 = (int *)malloc(4000);
  p_05->pArray = piVar9;
  pVVar13 = p->vCos;
  uVar15 = (ulong)(uint)pVVar13->nSize;
  if (p->nRegs < pVVar13->nSize) {
    lVar19 = 0;
    do {
      if ((int)uVar15 <= lVar19) goto LAB_0056dbda;
      iVar1 = pVVar13->pArray[lVar19];
      if ((iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0056dbf9;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      Vec_IntPush(p_00,iVar1);
      lVar19 = lVar19 + 1;
      pVVar13 = p->vCos;
      uVar15 = (ulong)pVVar13->nSize;
    } while (lVar19 < (long)(uVar15 - (long)p->nRegs));
  }
  Gia_ManCleanMark01(p);
  uVar18 = p_00->nSize;
  if (0 < (int)uVar18) {
    local_70 = 0;
    uVar17 = 0;
    do {
      if (p_00->pArray[(ulong)uVar18 - 1] <= (int)uVar17) {
        Gia_ManCleanMark01(p);
        Vec_IntPush(p_01,vIns->nSize);
        Vec_IntPush(p_02,vCuts->nSize);
        Vec_IntPush(p_03,p_00->nSize);
        Vec_IntPush(p_04,vObjs->nSize);
        p_06 = Gia_ManStart(p->nObjs);
        pcVar5 = p->pName;
        if (pcVar5 == (char *)0x0) {
          pcVar11 = (char *)0x0;
        }
        else {
          sVar10 = strlen(pcVar5);
          pcVar11 = (char *)malloc(sVar10 + 1);
          strcpy(pcVar11,pcVar5);
        }
        p_06->pName = pcVar11;
        pcVar5 = p->pSpec;
        if (pcVar5 == (char *)0x0) {
          pcVar11 = (char *)0x0;
        }
        else {
          sVar10 = strlen(pcVar5);
          pcVar11 = (char *)malloc(sVar10 + 1);
          strcpy(pcVar11,pcVar5);
        }
        p_06->pSpec = pcVar11;
        Gia_ManFillValue(p);
        p->pObjs->Value = 0;
        if (vIns->nSize < 1) goto LAB_0056d5e1;
        lVar19 = 0;
        goto LAB_0056d4cf;
      }
      Vec_IntPush(p_01,vIns->nSize);
      Vec_IntPush(p_02,vCuts->nSize);
      Vec_IntPush(p_03,p_00->nSize);
      Vec_IntPush(p_04,vObjs->nSize);
      if ((long)p_00->nSize < 1) break;
      uVar2 = p_00->pArray[(long)p_00->nSize + -1];
      if ((int)uVar17 < (int)uVar2) {
        uVar18 = uVar17;
        do {
          if (((int)uVar17 < 0) || (p_00->nSize <= (int)uVar18)) goto LAB_0056dbda;
          Gia_ManIncrementTravId(p);
          if (p->nObjs <= (int)uVar17) goto LAB_0056dbf9;
          Bmc_SuperBuildTents_rec
                    (p,uVar17 - (*(uint *)(p->pObjs + uVar17) & 0x1fffffff),vIns,vCuts,p_00,vObjs,
                     vRankIns,vRankCuts,(int)local_70);
          uVar18 = uVar18 + 1;
        } while (uVar2 != uVar18);
      }
      local_70 = local_70 + 1;
      uVar18 = p_00->nSize;
      uVar17 = uVar2;
    } while (0 < (int)uVar18);
  }
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
  while( true ) {
    pGVar12 = Gia_ManAppendObj(p_06);
    uVar15 = *(ulong *)pGVar12;
    *(ulong *)pGVar12 = uVar15 | 0x9fffffff;
    *(ulong *)pGVar12 =
         uVar15 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_06->vCis->nSize & 0x1fffffff) << 0x20;
    pGVar7 = p_06->pObjs;
    if ((pGVar12 < pGVar7) || (pGVar7 + p_06->nObjs <= pGVar12)) goto LAB_0056dc37;
    Vec_IntPush(p_06->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar7) >> 2) * -0x55555555);
    pGVar7 = p_06->pObjs;
    if ((pGVar12 < pGVar7) || (pGVar7 + p_06->nObjs <= pGVar12)) goto LAB_0056dc37;
    pGVar6[iVar1].Value = (int)((ulong)((long)pGVar12 - (long)pGVar7) >> 2) * 0x55555556;
    lVar19 = lVar19 + 1;
    if (vIns->nSize <= lVar19) break;
LAB_0056d4cf:
    iVar1 = vIns->pArray[lVar19];
    if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0056dbf9;
    pGVar6 = p->pObjs;
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
  }
LAB_0056d5e1:
  if (0 < vCuts->nSize) {
    lVar19 = 0;
    do {
      iVar1 = vCuts->pArray[lVar19];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0056dbf9;
      pGVar6 = p->pObjs;
      if (pGVar6 == (Gia_Obj_t *)0x0) break;
      pGVar12 = Gia_ManAppendObj(p_06);
      uVar15 = *(ulong *)pGVar12;
      *(ulong *)pGVar12 = uVar15 | 0x9fffffff;
      *(ulong *)pGVar12 =
           uVar15 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_06->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar7 = p_06->pObjs;
      if ((pGVar12 < pGVar7) || (pGVar7 + p_06->nObjs <= pGVar12)) {
LAB_0056dc37:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_06->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar7) >> 2) * -0x55555555);
      pGVar7 = p_06->pObjs;
      if ((pGVar12 < pGVar7) || (pGVar7 + p_06->nObjs <= pGVar12)) goto LAB_0056dc37;
      pGVar6[iVar1].Value = (int)((ulong)((long)pGVar12 - (long)pGVar7) >> 2) * 0x55555556;
      lVar19 = lVar19 + 1;
    } while (lVar19 < vCuts->nSize);
  }
  iVar1 = p_03->nSize;
  lVar19 = local_70;
  do {
    if (iVar1 <= (int)local_70) goto LAB_0056dbda;
    iVar16 = (int)lVar19 + 1;
    if (iVar1 <= iVar16) goto LAB_0056dbda;
    piVar9 = p_03->pArray;
    uVar18 = piVar9[lVar19];
    uVar15 = (ulong)uVar18;
    while ((int)uVar15 < piVar9[lVar19 + 1]) {
      if (((int)uVar18 < 0) || (p_00->nSize <= (int)uVar15)) goto LAB_0056dbda;
      iVar3 = p_00->pArray[uVar15];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_0056dbf9;
      pGVar6 = p->pObjs + iVar3;
      if ((int)pGVar6[-(ulong)((uint)*(undefined8 *)pGVar6 & 0x1fffffff)].Value < 0)
      goto LAB_0056dc18;
      uVar15 = uVar15 + 1;
      pGVar6->Value =
           (uint)*(undefined8 *)pGVar6 >> 0x1d & 1 ^
           pGVar6[-(ulong)((uint)*(undefined8 *)pGVar6 & 0x1fffffff)].Value;
      if (iVar1 <= iVar16) goto LAB_0056dbda;
    }
    iVar3 = p_04->nSize;
    if ((iVar3 <= (int)lVar19) || (iVar3 <= iVar16)) goto LAB_0056dbda;
    piVar9 = p_04->pArray;
    uVar18 = piVar9[lVar19];
    uVar15 = (ulong)uVar18;
    while ((int)uVar15 < piVar9[lVar19 + 1]) {
      if (((int)uVar18 < 0) || (vObjs->nSize <= (int)uVar15)) goto LAB_0056dbda;
      iVar4 = vObjs->pArray[uVar15];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_0056dbf9;
      pGVar6 = p->pObjs + iVar4;
      if ((int)pGVar6[-(ulong)((uint)*(undefined8 *)pGVar6 & 0x1fffffff)].Value < 0)
      goto LAB_0056dc18;
      uVar15 = uVar15 + 1;
      pGVar6->Value =
           (uint)*(undefined8 *)pGVar6 >> 0x1d & 1 ^
           pGVar6[-(ulong)((uint)*(undefined8 *)pGVar6 & 0x1fffffff)].Value;
      if (iVar3 <= iVar16) goto LAB_0056dbda;
    }
    bVar8 = 0 < lVar19;
    lVar19 = lVar19 + -1;
  } while (bVar8);
  pVVar13 = p->vCos;
  uVar15 = (ulong)(uint)pVVar13->nSize;
  if (p->nRegs < pVVar13->nSize) {
    lVar19 = 0;
    do {
      if ((int)uVar15 <= lVar19) goto LAB_0056dbda;
      iVar1 = pVVar13->pArray[lVar19];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0056dbf9;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar6 = p->pObjs + iVar1;
      uVar17 = (uint)*(undefined8 *)pGVar6;
      uVar18 = pGVar6[-(ulong)(uVar17 & 0x1fffffff)].Value;
      if ((int)uVar18 < 0) goto LAB_0056dc18;
      Gia_ManAppendCo(p_06,uVar17 >> 0x1d & 1 ^ uVar18);
      lVar19 = lVar19 + 1;
      pVVar13 = p->vCos;
      uVar15 = (ulong)pVVar13->nSize;
    } while (lVar19 < (long)(uVar15 - (long)p->nRegs));
  }
  uVar18 = vCuts->nSize;
  uVar15 = (ulong)uVar18;
  if (0 < (int)uVar18) {
    lVar19 = 0;
    do {
      uVar18 = (uint)uVar15;
      iVar1 = vCuts->pArray[lVar19];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_0056dbf9:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar6 = p->pObjs + iVar1;
      uVar17 = (uint)*(undefined8 *)pGVar6;
      uVar18 = pGVar6[-(ulong)(uVar17 & 0x1fffffff)].Value;
      if ((int)uVar18 < 0) {
LAB_0056dc18:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      Gia_ManAppendCo(p_06,uVar17 >> 0x1d & 1 ^ uVar18);
      lVar19 = lVar19 + 1;
      uVar18 = vCuts->nSize;
      uVar15 = (ulong)(int)uVar18;
    } while (lVar19 < (long)uVar15);
  }
  Gia_ManSetRegNum(p_06,uVar18);
  if (0 < vIns->nSize) {
    lVar19 = 0;
    do {
      if (vRankIns->nSize <= lVar19) goto LAB_0056dbda;
      iVar1 = vRankIns->pArray[lVar19];
      Vec_IntPush(p_05,vIns->pArray[lVar19]);
      Vec_IntPush(p_05,iVar1);
      lVar19 = lVar19 + 1;
    } while (lVar19 < vIns->nSize);
  }
  if (0 < vCuts->nSize) {
    lVar19 = 0;
    do {
      if (vRankCuts->nSize <= lVar19) {
LAB_0056dbda:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = vRankCuts->pArray[lVar19];
      Vec_IntPush(p_05,vCuts->pArray[lVar19]);
      Vec_IntPush(p_05,iVar1);
      lVar19 = lVar19 + 1;
    } while (lVar19 < vCuts->nSize);
  }
  if (vIns->pArray != (int *)0x0) {
    free(vIns->pArray);
    vIns->pArray = (int *)0x0;
  }
  free(vIns);
  if (vCuts->pArray != (int *)0x0) {
    free(vCuts->pArray);
    vCuts->pArray = (int *)0x0;
  }
  free(vCuts);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  if (vObjs->pArray != (int *)0x0) {
    free(vObjs->pArray);
    vObjs->pArray = (int *)0x0;
  }
  free(vObjs);
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
    p_01->pArray = (int *)0x0;
  }
  free(p_01);
  if (p_02->pArray != (int *)0x0) {
    free(p_02->pArray);
    p_02->pArray = (int *)0x0;
  }
  free(p_02);
  if (p_03->pArray != (int *)0x0) {
    free(p_03->pArray);
    p_03->pArray = (int *)0x0;
  }
  free(p_03);
  if (p_04->pArray != (int *)0x0) {
    free(p_04->pArray);
    p_04->pArray = (int *)0x0;
  }
  free(p_04);
  if (vRankIns->pArray != (int *)0x0) {
    free(vRankIns->pArray);
    vRankIns->pArray = (int *)0x0;
  }
  free(vRankIns);
  if (vRankCuts->pArray != (int *)0x0) {
    free(vRankCuts->pArray);
    vRankCuts->pArray = (int *)0x0;
  }
  free(vRankCuts);
  if (pvMap == (Vec_Int_t **)0x0) {
    if (p_05->pArray != (int *)0x0) {
      free(p_05->pArray);
      p_05->pArray = (int *)0x0;
    }
    free(p_05);
  }
  else {
    *pvMap = p_05;
  }
  pGVar14 = Gia_ManCleanup(p_06);
  Gia_ManStop(p_06);
  return pGVar14;
}

Assistant:

Gia_Man_t * Bmc_SuperBuildTents( Gia_Man_t * p, Vec_Int_t ** pvMap )
{
    Vec_Int_t * vIns      = Vec_IntAlloc( 1000 );
    Vec_Int_t * vCuts     = Vec_IntAlloc( 1000 );
    Vec_Int_t * vFlops    = Vec_IntAlloc( 1000 );
    Vec_Int_t * vObjs     = Vec_IntAlloc( 1000 );
    Vec_Int_t * vLimIns   = Vec_IntAlloc( 1000 );
    Vec_Int_t * vLimCuts  = Vec_IntAlloc( 1000 );
    Vec_Int_t * vLimFlops = Vec_IntAlloc( 1000 );
    Vec_Int_t * vLimObjs  = Vec_IntAlloc( 1000 );
    Vec_Int_t * vRankIns  = Vec_IntAlloc( 1000 );
    Vec_Int_t * vRankCuts = Vec_IntAlloc( 1000 );
    Vec_Int_t * vMap      = Vec_IntAlloc( 1000 );
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, r, Entry, Rank, iPrev, iThis = 0;
    // collect internal nodes
    Gia_ManForEachPo( p, pObj, i )
        Vec_IntPush( vFlops, Gia_ObjId(p, pObj) );
    Gia_ManCleanMark01( p );
    for ( Rank = 0; iThis < Vec_IntEntryLast(vFlops); Rank++ )
    {
        Vec_IntPush( vLimIns,   Vec_IntSize(vIns)   );
        Vec_IntPush( vLimCuts,  Vec_IntSize(vCuts)  );
        Vec_IntPush( vLimFlops, Vec_IntSize(vFlops) );
        Vec_IntPush( vLimObjs,  Vec_IntSize(vObjs)  );
        iPrev = iThis;
        iThis = Vec_IntEntryLast(vFlops);
        Vec_IntForEachEntryStartStop( vFlops, Entry, i, iPrev, iThis )
        {
            Gia_ManIncrementTravId( p );
            Bmc_SuperBuildTents_rec( p, Gia_ObjFaninId0(Gia_ManObj(p, iPrev), iPrev), vIns, vCuts, vFlops, vObjs, vRankIns, vRankCuts, Rank );
        }
    }
    Gia_ManCleanMark01( p );
    Vec_IntPush( vLimIns,   Vec_IntSize(vIns)   );
    Vec_IntPush( vLimCuts,  Vec_IntSize(vCuts)  );
    Vec_IntPush( vLimFlops, Vec_IntSize(vFlops) );
    Vec_IntPush( vLimObjs,  Vec_IntSize(vObjs)  );
    // create new GIA
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObjVec( vIns, p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachObjVec( vCuts, p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    for ( r = Rank; r >= 0; r-- )
    {
        Vec_IntForEachEntryStartStop( vFlops, Entry, i, Vec_IntEntry(vLimFlops, r), Vec_IntEntry(vLimFlops, r+1) )
        {
            pObj = Gia_ManObj(p, Entry);
            pObj->Value = Gia_ObjFanin0Copy(pObj);
        }
        Vec_IntForEachEntryStartStop( vObjs, Entry, i, Vec_IntEntry(vLimObjs, r), Vec_IntEntry(vLimObjs, r+1) )
        {
            pObj = Gia_ManObj(p, Entry);
            pObj->Value = Gia_ObjFanin0Copy(pObj);
        }
    }
    Gia_ManForEachPo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachObjVec( vCuts, p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Vec_IntSize(vCuts) );

    // create map
    Vec_IntForEachEntryTwo( vIns, vRankIns, Entry, Rank, i )
        Vec_IntPushTwo( vMap, Entry, Rank );
    Vec_IntForEachEntryTwo( vCuts, vRankCuts, Entry, Rank, i )
        Vec_IntPushTwo( vMap, Entry, Rank );

    Vec_IntFree( vIns   );
    Vec_IntFree( vCuts  );
    Vec_IntFree( vFlops );
    Vec_IntFree( vObjs  );

    Vec_IntFree( vLimIns   );
    Vec_IntFree( vLimCuts  );
    Vec_IntFree( vLimFlops );
    Vec_IntFree( vLimObjs  );

    Vec_IntFree( vRankIns  );
    Vec_IntFree( vRankCuts  );

    if ( pvMap )
        *pvMap = vMap;
    else
        Vec_IntFree( vMap );

    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}